

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarExecFuse.cpp
# Opt level: O2

void anon_unknown.dwarf_5eda::check_file_sanity(string *path,Expectation expected,mode_t perms)

{
  bool bVar1;
  int iVar2;
  __uid_t _Var3;
  __gid_t _Var4;
  ostream *poVar5;
  int *piVar6;
  char *pcVar7;
  undefined1 auStack_238 [392];
  stat st;
  
  iVar2 = stat((path->_M_dataplus)._M_p,(stat *)&st);
  if (iVar2 == 0) {
    _Var3 = geteuid();
    if (st.st_uid == _Var3) {
      _Var4 = getegid();
      if (st.st_gid != _Var4) {
        bVar1 = tools::xar::is_user_in_group(st.st_gid);
        if (!bVar1) {
          memset(auStack_238,0,0x188);
          std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
          poVar5 = std::operator<<((ostream *)(auStack_238 + 0x10),"FATAL ");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5e);
          poVar5 = std::operator<<(poVar5,": ");
          poVar5 = std::operator<<(poVar5,"Invalid group of ");
          std::operator<<(poVar5,(string *)path);
          goto LAB_00105cfa;
        }
      }
      if (expected == File) {
        if ((st.st_mode & 0xf000) != 0x8000) {
          memset(auStack_238,0,0x188);
          std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
          poVar5 = std::operator<<((ostream *)(auStack_238 + 0x10),"FATAL ");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x65);
          poVar5 = std::operator<<(poVar5,": ");
          poVar5 = std::operator<<(poVar5,"Should be a normal file: ");
          std::operator<<(poVar5,(string *)path);
          goto LAB_00105cfa;
        }
      }
      else if ((expected == Directory) && ((st.st_mode & 0xf000) != 0x4000)) {
        memset(auStack_238,0,0x188);
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
        poVar5 = std::operator<<((ostream *)(auStack_238 + 0x10),"FATAL ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x62);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = std::operator<<(poVar5,"Should be a directory: ");
        std::operator<<(poVar5,(string *)path);
        goto LAB_00105cfa;
      }
      if ((st.st_mode & 0xfff) == perms) {
        return;
      }
      memset(auStack_238,0,0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
      poVar5 = std::operator<<((ostream *)(auStack_238 + 0x10),"FATAL ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x68);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::operator<<(poVar5,"Invalid permissions on ");
      poVar5 = std::operator<<(poVar5,(string *)path);
      poVar5 = std::operator<<(poVar5,", expected ");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,", got ");
      std::ostream::operator<<(poVar5,st.st_mode & 0xfff);
    }
    else {
      memset(auStack_238,0,0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
      poVar5 = std::operator<<((ostream *)(auStack_238 + 0x10),"FATAL ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x59);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::operator<<(poVar5,"Invalid owner of ");
      std::operator<<(poVar5,(string *)path);
    }
  }
  else {
    memset(auStack_238,0,0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
    poVar5 = std::operator<<((ostream *)(auStack_238 + 0x10),"FATAL ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x57);
    poVar5 = std::operator<<(poVar5,": ");
    poVar5 = std::operator<<(poVar5,"stat(path.c_str(), &st) == 0");
    poVar5 = std::operator<<(poVar5,": ");
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<(poVar5,pcVar7);
  }
LAB_00105cfa:
  tools::xar::detail::LogFatal::~LogFatal((LogFatal *)auStack_238);
}

Assistant:

void check_file_sanity(
    const std::string& path,
    enum Expectation expected,
    mode_t perms) {
  struct stat st;
  XAR_PCHECK_SIMPLE(stat(path.c_str(), &st) == 0);
  if (st.st_uid != geteuid()) {
    XAR_FATAL << "Invalid owner of " << path;
  }

  // Verify the directory is owned by one of the groups the user is in.
  if (st.st_gid != getegid() && !tools::xar::is_user_in_group(st.st_gid)) {
    XAR_FATAL << "Invalid group of " << path;
  }

  if (expected == Expectation::Directory && !S_ISDIR(st.st_mode)) {
    XAR_FATAL << "Should be a directory: " << path;
  }
  if (expected == Expectation::File && !S_ISREG(st.st_mode)) {
    XAR_FATAL << "Should be a normal file: " << path;
  }
  if ((st.st_mode & 07777) != perms) {
    XAR_FATAL << "Invalid permissions on " << path << ", expected " << std::oct
              << perms << ", got " << (st.st_mode & 07777);
  }
}